

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

bool __thiscall
ON_PostEffects::MovePostEffectBefore(ON_PostEffects *this,ON_UUID *id_move,ON_UUID *id_before)

{
  ON_SimpleArray<ON_PostEffect_*> *this_00;
  CImpl *this_01;
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  undefined8 uVar6;
  ON_PostEffect *pep_move;
  ON_PostEffect *local_38;
  long *plVar4;
  
  bVar1 = ::operator==(id_move,id_before);
  if ((!bVar1) && (uVar2 = CImpl::IndexOfPostEffect(this->_impl,id_move), -1 < (int)uVar2)) {
    this_01 = this->_impl;
    CImpl::EnsurePopulated(this_01);
    this_00 = &this_01->_peps;
    local_38 = (this_01->_peps).m_a[uVar2];
    (*(this_01->_peps)._vptr_ON_SimpleArray[2])(this_00,(ulong)uVar2);
    iVar3 = (*local_38->_vptr_ON_PostEffect[0x10])();
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    plVar5 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
    if (plVar5 != (long *)0x0) {
      bVar1 = ON_UuidIsNil(id_before);
      if (bVar1) {
        uVar6 = (**(code **)(*plVar5 + 0x88))(plVar5,plVar4);
        (**(code **)(*plVar5 + 0x58))(plVar5,uVar6);
        ON_SimpleArray<ON_PostEffect_*>::Append(this_00,&local_38);
      }
      else {
        uVar2 = CImpl::IndexOfPostEffect(this->_impl,id_before);
        if ((int)uVar2 < 0) {
          return false;
        }
        ON_SimpleArray<ON_PostEffect_*>::Insert(this_00,uVar2,&local_38);
        iVar3 = (*(this_01->_peps).m_a[uVar2]->_vptr_ON_PostEffect[0x10])();
        (**(code **)(*plVar4 + 0xa8))(plVar4,iVar3);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PostEffects::MovePostEffectBefore(const ON_UUID& id_move, const ON_UUID& id_before)
{
  if (id_move == id_before)
    return false;

  const int index_move = _impl->IndexOfPostEffect(id_move);
  if (index_move < 0)
    return false;

  auto& pel = _impl->PostEffectList();

  ON_PostEffect* pep_move = pel[index_move];
  pel.Remove(index_move);

  ON_XMLNode& xml_move = pep_move->XMLNode();

  ON_XMLNode* parent = xml_move.Parent();
  if (nullptr == parent)
    return false; // Should never happen.

  if (ON_UuidIsNil(id_before))
  {
    ON_XMLNode* xml_move_detached = parent->DetachChild(xml_move);
    parent->AttachChildNode(xml_move_detached);
    pel.Append(pep_move);
  }
  else
  {
    const int index_before = _impl->IndexOfPostEffect(id_before);
    if (index_before < 0)
      return false;

    pel.Insert(index_before, pep_move);

    ON_XMLNode& xml_before = pel[index_before]->XMLNode();
    xml_move.MoveBefore(xml_before);
  }

  return true;
}